

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.cxx
# Opt level: O3

string * __thiscall
FileParse::formatDouble_abi_cxx11_
          (string *__return_storage_ptr__,FileParse *this,double value,int precision,
          double scientificLowerBound,double scientificUpperBound)

{
  pointer __s;
  long *plVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  bool useScientific;
  ostringstream tempStream;
  long local_198;
  long local_190 [2];
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  if ((ABS(value) < scientificLowerBound) || (scientificUpperBound < ABS(value))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    plVar1 = (long *)(local_198 + -0x18);
    lVar3 = *(long *)(local_198 + -0x18);
    if ((value != 0.0) || (NAN(value))) {
      uVar4 = 0x100;
      useScientific = true;
    }
    else {
      useScientific = false;
      uVar4 = 4;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    lVar3 = *(long *)(local_198 + -0x18);
    plVar1 = (long *)(local_198 + -0x18);
    uVar4 = 4;
    useScientific = false;
  }
  *(uint *)((long)auStack_180 + lVar3) = *(uint *)((long)auStack_180 + lVar3) & 0xfffffefb | uVar4;
  *(long *)((long)local_190 + *plVar1) = (long)(int)this;
  std::ostream::_M_insert<double>(value);
  std::__cxx11::stringbuf::str();
  if (__return_storage_ptr__->_M_string_length != 0) {
    __s = (__return_storage_ptr__->_M_dataplus)._M_p;
    pvVar2 = memchr(__s,0x2e,__return_storage_ptr__->_M_string_length);
    if ((long)pvVar2 - (long)__s != -1 && pvVar2 != (void *)0x0) {
      trimTrailingZeros(__return_storage_ptr__,useScientific);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string formatDouble(double value,
                      int precision,
                      double scientificLowerBound,
                      double scientificUpperBound)
    {
        bool useScientific = (std::abs(value) < scientificLowerBound || std::abs(value) > scientificUpperBound)
                             && value != 0.0;

        std::ostringstream tempStream;
        tempStream.setf(useScientific ? std::ios::scientific : std::ios::fixed, std::ios::floatfield);
        tempStream.precision(precision);
        tempStream << value;

        std::string str = tempStream.str();  // Get the formatted string

        // Trim trailing zeros if there is a decimal point in the string
        if (str.find('.') != std::string::npos)
        {
            trimTrailingZeros(str, useScientific);
        }

        return str;  // Return the final formatted string
    }